

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_7a1d53::cURLProgressHelper::UpdatePercentage
          (cURLProgressHelper *this,double value,double total,string *status)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  int iVar4;
  ostringstream oss;
  long *local_1c0 [2];
  long local_1b0 [2];
  undefined1 local_1a0 [376];
  
  iVar1 = this->CurrentPercentage;
  if (0.0 < total) {
    iVar2 = (int)((value / total) * 100.0 + 0.5);
    iVar4 = 100;
    if (iVar2 < 100) {
      iVar4 = iVar2;
    }
    this->CurrentPercentage = iVar4;
  }
  iVar4 = this->CurrentPercentage;
  if (iVar1 != iVar4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"[",1);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a0,(this->Text)._M_dataplus._M_p,
                        (this->Text)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->CurrentPercentage);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"% complete]",0xb);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)status,(string *)local_1c0);
    if (local_1c0[0] != local_1b0) {
      operator_delete(local_1c0[0],local_1b0[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  }
  return iVar1 != iVar4;
}

Assistant:

bool UpdatePercentage(double value, double total, std::string &status)
      {
      int OldPercentage = this->CurrentPercentage;

      if (total > 0.0)
        {
        this->CurrentPercentage = static_cast<int>(value/total*100.0 + 0.5);
        if(this->CurrentPercentage > 100)
          {
          // Avoid extra progress reports for unexpected data beyond total.
          this->CurrentPercentage = 100;
          }
        }

      bool updated = (OldPercentage != this->CurrentPercentage);

      if (updated)
        {
        std::ostringstream oss;
        oss << "[" << this->Text << " " << this->CurrentPercentage
            << "% complete]";
        status = oss.str();
        }

      return updated;
      }